

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
AlexDataNode(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
             *this,AlexCompare *comp,allocator<std::pair<int,_int>_> *alloc)

{
  int iVar1;
  undefined8 in_RDX;
  _func_int **in_RSI;
  AlexNode<int,_int> *in_RDI;
  bool in_stack_ffffffffffffffdd;
  short in_stack_ffffffffffffffde;
  
  AlexNode<int,_int>::AlexNode(in_RDI,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdd);
  in_RDI->_vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_0012abd0;
  in_RDI[1]._vptr_AlexNode = in_RSI;
  in_RDI[1].is_leaf_ = (bool)(char)in_RDX;
  in_RDI[1].duplication_factor_ = (char)((ulong)in_RDX >> 8);
  in_RDI[1].level_ = (short)((ulong)in_RDX >> 0x10);
  *(int *)&in_RDI[1].field_0xc = (int)((ulong)in_RDX >> 0x20);
  in_RDI[1].model_.a_ = 0.0;
  in_RDI[1].model_.b_ = 0.0;
  in_RDI[1].cost_ = 0.0;
  in_RDI[2]._vptr_AlexNode = (_func_int **)0x0;
  in_RDI[2].is_leaf_ = false;
  in_RDI[2].duplication_factor_ = '\0';
  in_RDI[2].level_ = 0;
  *(undefined4 *)&in_RDI[2].field_0xc = 0;
  in_RDI[2].model_.a_ = 0.0;
  *(undefined4 *)&in_RDI[2].model_.b_ = 0;
  in_RDI[2].cost_ = 1.0;
  in_RDI[3]._vptr_AlexNode = (_func_int **)0x0;
  in_RDI[3].is_leaf_ = false;
  in_RDI[3].duplication_factor_ = '\0';
  in_RDI[3].level_ = 0x20;
  in_RDI[3].model_.a_ = 0.0;
  in_RDI[3].model_.b_ = 0.0;
  *(undefined4 *)&in_RDI[3].cost_ = 0;
  *(undefined4 *)((long)&in_RDI[3].cost_ + 4) = 0;
  *(undefined4 *)&in_RDI[4]._vptr_AlexNode = 0;
  iVar1 = std::numeric_limits<int>::lowest();
  *(int *)((long)&in_RDI[4]._vptr_AlexNode + 4) = iVar1;
  iVar1 = std::numeric_limits<int>::max();
  in_RDI[4].is_leaf_ = (bool)(char)iVar1;
  in_RDI[4].duplication_factor_ = (char)((uint)iVar1 >> 8);
  in_RDI[4].level_ = (short)((uint)iVar1 >> 0x10);
  *(undefined4 *)&in_RDI[4].field_0xc = 0;
  *(undefined4 *)&in_RDI[4].model_.a_ = 0;
  in_RDI[4].model_.b_ = 0.0;
  in_RDI[4].cost_ = 0.0;
  return;
}

Assistant:

explicit AlexDataNode(const Compare& comp = Compare(),
                        const Alloc& alloc = Alloc())
      : AlexNode<T, P>(0, true), key_less_(comp), allocator_(alloc) {}